

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

Aig_Man_t * Saig_ManDupCones(Aig_Man_t *pAig,int *pPos,int nPos)

{
  void *pvVar1;
  char *__s;
  int *piVar2;
  Vec_Ptr_t *vLeaves;
  void **ppvVar3;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  Aig_Obj_t *p1;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vLeaves->pArray = ppvVar3;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vRoots->pArray = ppvVar3;
  uVar7 = (ulong)(uint)nPos;
  if (0 < nPos) {
    uVar8 = 0;
    do {
      iVar9 = pPos[uVar8];
      if (((long)iVar9 < 0) || (pAig->vCos->nSize <= iVar9)) goto LAB_006df372;
      pvVar1 = pAig->vCos->pArray[iVar9];
      uVar6 = vRoots->nCap;
      if (vRoots->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,0x80);
          }
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar6 * 2;
          if (iVar9 <= (int)uVar6) goto LAB_006df0c8;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,(ulong)uVar6 << 4);
          }
        }
        vRoots->pArray = ppvVar3;
        vRoots->nCap = iVar9;
      }
LAB_006df0c8:
      iVar9 = vRoots->nSize;
      vRoots->nSize = iVar9 + 1;
      vRoots->pArray[iVar9] = pvVar1;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  if (0 < vRoots->nSize) {
    lVar10 = 0;
    do {
      Saig_ManDupCones_rec(pAig,(Aig_Obj_t *)vRoots->pArray[lVar10],vLeaves,vNodes,vRoots);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vRoots->nSize);
  }
  p = Aig_ManStart(vNodes->nSize);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < vLeaves->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = vLeaves->pArray[lVar10];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vLeaves->nSize);
  }
  if (nPos < vRoots->nSize) {
    do {
      if (nPos < 0) {
LAB_006df372:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar2 = (int *)vRoots->pArray[uVar7];
      pAVar5 = Aig_ObjCreateCi(p);
      if (((piVar2[6] & 7U) != 3) || (iVar9 = *piVar2, iVar9 < pAig->nTruePos)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar6 = (iVar9 - pAig->nTruePos) + pAig->nTruePis;
      if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_006df372;
      *(Aig_Obj_t **)((long)pAig->vCis->pArray[uVar6] + 0x28) = pAVar5;
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < vRoots->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = vNodes->pArray[lVar10];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_006df391;
      uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)
             ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      pAVar5 = Aig_And(p,pAVar5,p1);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vNodes->nSize);
  }
  iVar9 = vRoots->nSize;
  if (0 < iVar9) {
    lVar10 = 0;
    do {
      if (((ulong)vRoots->pArray[lVar10] & 1) != 0) {
LAB_006df391:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)vRoots->pArray[lVar10] + 8);
      uVar8 = uVar7 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar10 = lVar10 + 1;
      iVar9 = vRoots->nSize;
    } while (lVar10 < iVar9);
  }
  Aig_ManSetRegNum(p,iVar9 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (void **)0x0;
  }
  free(vRoots);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupCones( Aig_Man_t * pAig, int * pPos, int nPos )
{
    Aig_Man_t * pAigNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Aig_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Aig_ManCo(pAig, pPos[i]) );

    // mark internal nodes
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManDupCones_rec( pAig, pObj, vLeaves, vNodes, vRoots );

    // start the new manager
    pAigNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create PIs
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // create LOs
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vRoots, pObj, i, nPos )
        Saig_ObjLiToLo(pAig, pObj)->pData = Aig_ObjCreateCi( pAigNew );
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManSetRegNum( pAigNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pAigNew;

}